

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

vector<CLI::App_*,_std::allocator<CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__return_storage_ptr__,App *this,
          bool parsed)

{
  size_type __n;
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  allocator<CLI::App_*> local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  App *pAStack_18;
  bool parsed_local;
  App *this_local;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *subcomms;
  
  local_19 = parsed;
  pAStack_18 = this;
  this_local = (App *)__return_storage_ptr__;
  if (parsed) {
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
              (__return_storage_ptr__,&this->parsed_subcommands_);
  }
  else {
    local_1a = 0;
    __n = std::
          vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
          ::size(&this->subcommands_);
    std::allocator<CLI::App_*>::allocator(&local_1b);
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
              (__return_storage_ptr__,__n,&local_1b);
    std::allocator<CLI::App_*>::~allocator(&local_1b);
    cVar1 = ::std::
            begin<std::vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>>
                      (&this->subcommands_);
    cVar2 = ::std::
            end<std::vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>>
                      (&this->subcommands_);
    iVar3 = ::std::begin<std::vector<CLI::App*,std::allocator<CLI::App*>>>(__return_storage_ptr__);
    ::std::
    transform<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>const*,std::vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>>,__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,CLI::App::get_subcommands(bool)const::_lambda(std::unique_ptr<CLI::App,std::default_delete<CLI::App>>const&)_1_>
              (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<App *> get_subcommands(bool parsed = true) const {
        if(parsed) {
            return parsed_subcommands_;
        } else {
            std::vector<App *> subcomms(subcommands_.size());
            std::transform(std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) {
                return v.get();
            });
            return subcomms;
        }
    }